

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O1

void sse::Threshold(uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *outY,
                   uint8_t *outYEnd,uint8_t minThreshold,uint8_t maxThreshold,uint32_t simdWidth,
                   uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined1 auVar4 [16];
  uint8_t *puVar5;
  long lVar6;
  ulong uVar7;
  uint8_t *puVar8;
  undefined1 auVar9 [16];
  
  if (outY != outYEnd) {
    auVar1 = vpbroadcastb_avx512vl();
    auVar2 = vpbroadcastb_avx512vl();
    puVar5 = outY + totalSimdWidth;
    puVar8 = inY + totalSimdWidth;
    auVar9[8] = 0x80;
    auVar9._0_8_ = 0x8080808080808080;
    auVar9[9] = 0x80;
    auVar9[10] = 0x80;
    auVar9[0xb] = 0x80;
    auVar9[0xc] = 0x80;
    auVar9[0xd] = 0x80;
    auVar9[0xe] = 0x80;
    auVar9[0xf] = 0x80;
    do {
      if (simdWidth != 0) {
        lVar6 = 0;
        do {
          uVar7 = vpcmpb_avx512vl(auVar1,auVar9 ^ *(undefined1 (*) [16])(inY + lVar6),2);
          uVar3 = vpcmpb_avx512vl(auVar9 ^ *(undefined1 (*) [16])(inY + lVar6),auVar2,2);
          auVar4 = vpmovm2b_avx512vl(uVar7 & uVar3);
          *(undefined1 (*) [16])(outY + lVar6) = auVar4;
          lVar6 = lVar6 + 0x10;
        } while ((ulong)simdWidth << 4 != lVar6);
      }
      if (nonSimdWidth != 0) {
        uVar7 = 0;
        do {
          puVar5[uVar7] = -(puVar8[uVar7] <= maxThreshold && minThreshold <= puVar8[uVar7]);
          uVar7 = uVar7 + 1;
        } while (nonSimdWidth != uVar7);
      }
      outY = outY + rowSizeOut;
      inY = inY + rowSizeIn;
      puVar5 = puVar5 + rowSizeOut;
      puVar8 = puVar8 + rowSizeIn;
    } while (outY != outYEnd);
  }
  return;
}

Assistant:

void Threshold( uint32_t rowSizeIn, uint32_t rowSizeOut, const uint8_t * inY, uint8_t * outY, const uint8_t * outYEnd, uint8_t minThreshold, uint8_t maxThreshold,
                    uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const char shiftMaskValue = static_cast<char>(0x80u);
        const simd shiftMask = _mm_set_epi8( shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue,
                                             shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue,
                                             shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue,
                                             shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue );

        const char notMaskValue = static_cast<char>(0xffu);
        const simd notMask = _mm_set_epi8( notMaskValue, notMaskValue, notMaskValue, notMaskValue,
                                           notMaskValue, notMaskValue, notMaskValue, notMaskValue,
                                           notMaskValue, notMaskValue, notMaskValue, notMaskValue,
                                           notMaskValue, notMaskValue, notMaskValue, notMaskValue );

        const char minCompareValue = static_cast<char>(minThreshold ^ 0x80u);
        const simd minCompare = _mm_set_epi8(
            minCompareValue, minCompareValue, minCompareValue, minCompareValue,
            minCompareValue, minCompareValue, minCompareValue, minCompareValue,
            minCompareValue, minCompareValue, minCompareValue, minCompareValue,
            minCompareValue, minCompareValue, minCompareValue, minCompareValue );

        const char maxCompareValue = static_cast<char>(maxThreshold ^ 0x80u);
        const simd maxCompare = _mm_set_epi8(
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue );

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const simd * src1 = reinterpret_cast <const simd*> (inY);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++dst ) {
                simd data = _mm_xor_si128( _mm_loadu_si128( src1 ), shiftMask );

                _mm_storeu_si128( dst, _mm_andnot_si128(
                    _mm_or_si128(
                        _mm_cmplt_epi8( data, minCompare ),
                        _mm_cmpgt_epi8( data, maxCompare ) ),
                    notMask ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * inX  = inY  + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++inX )
                    (*outX) = (*inX) < minThreshold || (*inX) > maxThreshold ? 0 : 255;
            }
        }
    }